

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathexec_env.c
# Opt level: O1

int pathexec_env(char *s,char *t)

{
  int iVar1;
  int iVar2;
  
  if (s == (char *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar1 = stralloc_copys(&tmp,s);
    iVar2 = 0;
    if (iVar1 != 0) {
      if (t != (char *)0x0) {
        iVar2 = stralloc_cats(&tmp,"=");
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = stralloc_cats(&tmp,t);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar1 = stralloc_append(&tmp,"");
      iVar2 = 0;
      if (iVar1 != 0) {
        iVar2 = stralloc_cat(&plus,&tmp);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int pathexec_env(const char *s,const char *t)
{
  if (!s) return 1;
  if (!stralloc_copys(&tmp,s)) return 0;
  if (t) {
    if (!stralloc_cats(&tmp,"=")) return 0;
    if (!stralloc_cats(&tmp,t)) return 0;
  }
  if (!stralloc_0(&tmp)) return 0;
  return stralloc_cat(&plus,&tmp);
}